

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

kd_tree_data_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>,2ul>
::operator()(build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>,_2UL>
             *this,space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_> space,
            splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *param_5)

{
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
  *this_00;
  node_type *pnVar1;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_RCX;
  undefined8 in_RDX;
  box_type *in_RSI;
  kd_tree_data_type *in_RDI;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_R8;
  node_type *root_node;
  node_allocator_type allocator;
  box_type root_box;
  vector<int,_std::allocator<int>_> indices;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> *this_01;
  kd_tree_data_type *pkVar2;
  kd_tree_data_type *this_02;
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  int *local_70;
  int *local_68;
  vector<int,_std::allocator<int>_> local_48;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *local_28;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *local_20;
  undefined8 local_10;
  
  this_02 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RDX;
  this_00 = (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
             *)space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>::size
                         ((space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>
                           *)0x107dde);
  std::allocator<int>::allocator((allocator<int> *)0x107df5);
  std::vector<int,_std::allocator<int>_>::vector
            (&this_02->indices,(size_type)in_RDI,in_stack_fffffffffffffee0);
  std::allocator<int>::~allocator((allocator<int> *)0x107e1b);
  this_01 = &local_48;
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffec8._M_current);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                              (in_stack_fffffffffffffec8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0);
  splitter_start_bounds_t<pico_tree::bounds_from_space_t>::derived(local_28);
  box_from_bounds<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>>
            ((build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>,_2UL>
              *)&local_90,in_RSI,local_10);
  chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL> *)
             in_stack_fffffffffffffed0._M_current);
  splitter_stop_condition_t<pico_tree::max_leaf_size_t>::derived(local_20);
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
  ::build_kd_tree_impl
            ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
              *)this_02,(space_type *)in_RDI,(size_type)this_01,in_stack_fffffffffffffed8,
             (node_allocator_type *)in_stack_fffffffffffffed0._M_current);
  pnVar1 = build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
           ::operator()(this_00,in_RSI);
  pkVar2 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            (&in_RDI->indices,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
  (pkVar2->root_box).storage_.coords_max._M_elems[0] = local_80;
  (pkVar2->root_box).storage_.coords_max._M_elems[1] = dStack_78;
  (pkVar2->root_box).storage_.coords_min._M_elems[0] = local_90;
  (pkVar2->root_box).storage_.coords_min._M_elems[1] = dStack_88;
  chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL> *)
             in_RDI,(chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>
                     *)in_stack_fffffffffffffec8._M_current);
  pkVar2->root_node = pnVar1;
  chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::~chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL> *)
             0x107f56);
  std::vector<int,_std::allocator<int>_>::~vector(this_01);
  return this_02;
}

Assistant:

kd_tree_data_type operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const&) {
    static_assert(
        std::is_same_v<scalar_type, typename SpaceWrapper_::scalar_type>);
    static_assert(Dim_ == SpaceWrapper_::dim);
    assert(space.size() > 0);

    using build_kd_tree_impl_type =
        build_kd_tree_impl<SpaceWrapper_, Stop_, Rule_, kd_tree_data_type>;
    using node_allocator_type = typename kd_tree_data_type::node_allocator_type;

    std::vector<index_type> indices(space.size());
    std::iota(indices.begin(), indices.end(), 0);
    box_type root_box = box_from_bounds(space, start_bounds.derived());
    node_allocator_type allocator;
    node_type* root_node = build_kd_tree_impl_type{
        space, stop_condition.derived().value, indices, allocator}(root_box);

    return kd_tree_data_type{
        std::move(indices), root_box, std::move(allocator), root_node};
  }